

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

ScriptFunction * __thiscall
Js::JavascriptLibrary::CreateScriptFunction(JavascriptLibrary *this,FunctionProxy *proxy)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  ScriptFunctionType *pSVar6;
  Recycler *pRVar7;
  FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunction>_> *this_00;
  FunctionWithComputedName<Js::ScriptFunction> *this_01;
  FunctionWithHomeObj<Js::ScriptFunction> *this_02;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  if ((proxy->functionInfo).ptr == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x568,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) goto LAB_00bfa790;
    *puVar5 = 0;
  }
  if ((((proxy->functionInfo).ptr)->functionBodyImpl).ptr != proxy) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x569,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar3) goto LAB_00bfa790;
    *puVar5 = 0;
  }
  if (((((proxy->functionInfo).ptr)->attributes & ClassConstructor) == None) ||
     (pSVar6 = FunctionProxy::GetUndeferredFunctionType(proxy), pSVar6 == (ScriptFunctionType *)0x0)
     ) {
    pSVar6 = FunctionProxy::EnsureDeferredPrototypeType(proxy);
  }
  else {
    pSVar6 = FunctionProxy::GetUndeferredFunctionType(proxy);
  }
  TVar1 = ((proxy->functionInfo).ptr)->attributes;
  if ((TVar1 & (HomeObj|ComputedName)) == None) {
    local_50 = (undefined1  [8])&ScriptFunction::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_766a001;
    data.filename._0_4_ = 0x18f2;
    pRVar7 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_50);
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                  ,0xa63,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00bfa790;
      *puVar5 = 0;
    }
    this_01 = (FunctionWithComputedName<Js::ScriptFunction> *)
              Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)1,false>
                        (pRVar7,0x48);
    if (this_01 == (FunctionWithComputedName<Js::ScriptFunction> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                  ,0xa70,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) goto LAB_00bfa790;
      *puVar5 = 0;
    }
    ScriptFunction::ScriptFunction((ScriptFunction *)this_01,proxy,pSVar6);
  }
  else {
    if ((~TVar1 & 0x2800000) == 0) {
      local_50 = (undefined1  [8])
                 &FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunction>>::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_766a001;
      data.filename._0_4_ = 0x18e8;
      pRVar7 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_50);
      BVar4 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                    ,0xa63,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_00bfa790;
        *puVar5 = 0;
      }
      this_00 = (FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunction>_> *)
                Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)1,false>
                          (pRVar7,0x58);
      if (this_00 == (FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunction>_> *)0x0)
      {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                    ,0xa70,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) goto LAB_00bfa790;
        *puVar5 = 0;
      }
      FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunction>_>::
      FunctionWithComputedName(this_00,proxy,pSVar6);
      return (ScriptFunction *)this_00;
    }
    if ((TVar1 >> 0x19 & 1) != 0) {
      local_50 = (undefined1  [8])&FunctionWithHomeObj<Js::ScriptFunction>::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_766a001;
      data.filename._0_4_ = 0x18ec;
      pRVar7 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_50);
      BVar4 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                    ,0xa63,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_00bfa790;
        *puVar5 = 0;
      }
      this_02 = (FunctionWithHomeObj<Js::ScriptFunction> *)
                Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)1,false>
                          (pRVar7,0x50);
      if (this_02 == (FunctionWithHomeObj<Js::ScriptFunction> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                    ,0xa70,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) goto LAB_00bfa790;
        *puVar5 = 0;
      }
      FunctionWithHomeObj<Js::ScriptFunction>::FunctionWithHomeObj(this_02,proxy,pSVar6);
      return &this_02->super_ScriptFunction;
    }
    local_50 = (undefined1  [8])&FunctionWithComputedName<Js::ScriptFunction>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_766a001;
    data.filename._0_4_ = 0x18f0;
    pRVar7 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_50);
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                  ,0xa63,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00bfa790;
      *puVar5 = 0;
    }
    this_01 = (FunctionWithComputedName<Js::ScriptFunction> *)
              Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)1,false>
                        (pRVar7,0x50);
    if (this_01 == (FunctionWithComputedName<Js::ScriptFunction> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                  ,0xa70,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) {
LAB_00bfa790:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    FunctionWithComputedName<Js::ScriptFunction>::FunctionWithComputedName(this_01,proxy,pSVar6);
  }
  return &this_01->super_ScriptFunction;
}

Assistant:

ScriptFunction* JavascriptLibrary::CreateScriptFunction(FunctionProxy * proxy)
    {
        ScriptFunctionType * type = proxy->IsClassConstructor() && proxy->GetUndeferredFunctionType() ? proxy->GetUndeferredFunctionType() : proxy->EnsureDeferredPrototypeType();
        FunctionInfo* functionInfo = proxy->GetFunctionInfo();
        if (functionInfo->HasComputedName() || functionInfo->HasHomeObj())
        {
            if (functionInfo->HasComputedName() && functionInfo->HasHomeObj())
            {
                return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, FunctionWithComputedName<FunctionWithHomeObj<ScriptFunction>>, proxy, type);
            }
            else if (functionInfo->HasHomeObj())
            {
                return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, FunctionWithHomeObj<ScriptFunction>, proxy, type);
            }

            // Has computed Name
            return RecyclerNewWithInfoBits(this->GetRecycler(), EnumFunctionClass, ScriptFunctionWithComputedName, proxy, type);
        }
        return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, ScriptFunction, proxy, type);
    }